

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O0

int __thiscall
curlpp::FormParts::File::clone
          (File *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  void *pvVar1;
  File *unaff_retaddr;
  
  pvVar1 = operator_new(0x68);
  File(unaff_retaddr,this);
  return (int)pvVar1;
}

Assistant:

curlpp::FormParts::File *
curlpp::FormParts::File::clone() const
{
   return new curlpp::FormParts::File(* this);
}